

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

void Gia_ManTestDoms2(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Vec_Int_t *vSupp;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_34;
  int i;
  abctime clk;
  Gia_Obj_t *pDom;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes;
  Gia_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  if (p->vDoms != (Vec_Int_t *)0x0) {
    __assert_fail("p->vDoms == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                  ,0xc4,"void Gia_ManTestDoms2(Gia_Man_t *)");
  }
  Gia_ManComputeDoms(p);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  Gia_ManCleanMark1(p);
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_34 < iVar1) {
      pDom = Gia_ManCi(p,local_34);
      bVar6 = pDom != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    *(ulong *)pDom = *(ulong *)pDom & 0xbfffffffffffffff | 0x4000000000000000;
    local_34 = local_34 + 1;
  }
  vSupp = Vec_IntAlloc(100);
  Gia_ManCreateRefs(p);
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_34 < iVar1) {
      pDom = Gia_ManCi(p,local_34);
      bVar6 = pDom != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjId(p,pDom);
    iVar2 = Gia_ObjDom(p,pDom);
    if (iVar1 != iVar2) {
      iVar1 = Gia_ObjDom(p,pDom);
      pGVar5 = Gia_ManObj(p,iVar1);
      iVar1 = Gia_ObjIsCo(pGVar5);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pGVar5);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsAnd(pDom)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                        ,0xdd,"void Gia_ManTestDoms2(Gia_Man_t *)");
        }
        Abs_GiaObjDeref_rec(p,pGVar5);
        Abs_ManSupport2(p,pGVar5,vSupp);
        Abs_GiaObjRef_rec(p,pGVar5);
        iVar1 = Gia_ObjId(p,pDom);
        iVar1 = Vec_IntFind(vSupp,iVar1);
        if (iVar1 == -1) {
          printf("FAILURE.\n");
        }
      }
      else {
        pGVar5 = Gia_ObjFanin0(pGVar5);
        if (pGVar5 != pDom) {
          __assert_fail("Gia_ObjFanin0(pDom) == pObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                        ,0xda,"void Gia_ManTestDoms2(Gia_Man_t *)");
        }
      }
    }
    local_34 = local_34 + 1;
  }
  Vec_IntFree(vSupp);
  Gia_ManCleanMark1(p);
  return;
}

Assistant:

void Gia_ManTestDoms2( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj, * pDom;
    abctime clk = Abc_Clock();
    int i;
    assert( p->vDoms == NULL );
    Gia_ManComputeDoms( p );
/*
    Gia_ManForEachPi( p, pObj, i )
        if ( Gia_ObjId(p, pObj) != Gia_ObjDom(p, pObj) )
            printf( "PI =%6d  Id =%8d. Dom =%8d.\n", i, Gia_ObjId(p, pObj), Gia_ObjDom(p, pObj) );
*/
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // for each dominated PI, when if the PIs is in a leaf of the MFFC of the dominator
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
    {
        if ( Gia_ObjId(p, pObj) == Gia_ObjDom(p, pObj) )
            continue;

        pDom = Gia_ManObj(p, Gia_ObjDom(p, pObj));
        if ( Gia_ObjIsCo(pDom) )
        {
            assert( Gia_ObjFanin0(pDom) == pObj );
            continue;
        }
        assert( Gia_ObjIsAnd(pDom) );
        Abs_GiaObjDeref_rec( p, pDom );
        Abs_ManSupport2( p, pDom, vNodes );
        Abs_GiaObjRef_rec( p, pDom );

        if ( Vec_IntFind(vNodes, Gia_ObjId(p, pObj)) == -1 )
            printf( "FAILURE.\n" );
//        else
//            printf( "Success.\n" );
    }
    Vec_IntFree( vNodes );
    Gia_ManCleanMark1( p );
}